

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O1

bool __thiscall
QGraphicsItem::collidesWithItem(QGraphicsItem *this,QGraphicsItem *other,ItemSelectionMode mode)

{
  undefined1 *puVar1;
  bool bVar2;
  int iVar3;
  QGraphicsItemPrivate *pQVar4;
  byte bVar5;
  QGraphicsItem *pQVar6;
  QGraphicsItem *pQVar7;
  long in_FS_OFFSET;
  QPainterPath otherShape;
  QPainterPath local_98 [8];
  undefined1 local_90 [88];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (other == this) {
    bVar5 = 1;
  }
  else if (other == (QGraphicsItem *)0x0) {
    bVar5 = 0;
  }
  else {
    if (((((this->d_ptr).d)->field_0x162 & 2) != 0) || ((((other->d_ptr).d)->field_0x162 & 2) != 0))
    {
      bVar2 = isAncestorOf(this,other);
      pQVar6 = this;
      if (!bVar2) {
        pQVar6 = ((this->d_ptr).d)->parent;
      }
      while ((pQVar6 != (QGraphicsItem *)0x0 &&
             (pQVar4 = (pQVar6->d_ptr).d, (*(ulong *)&pQVar4->field_0x160 & 0x1000000000) == 0))) {
        pQVar6 = pQVar4->parent;
      }
      bVar2 = isAncestorOf(other,this);
      pQVar7 = other;
      if (bVar2) goto LAB_005ec6b6;
      pQVar4 = (other->d_ptr).d;
      do {
        pQVar7 = pQVar4->parent;
LAB_005ec6b6:
      } while ((pQVar7 != (QGraphicsItem *)0x0) &&
              (pQVar4 = (pQVar7->d_ptr).d, (*(ulong *)&pQVar4->field_0x160 & 0x1000000000) == 0));
      if (pQVar6 == pQVar7) {
        puVar1 = &((this->d_ptr).d)->field_0x160;
        *(ulong *)puVar1 = *(ulong *)puVar1 | 0x8000000;
        (*other->_vptr_QGraphicsItem[4])(local_98,other);
        itemTransform((QTransform *)(local_90 + 8),other,this,(bool *)0x0);
        QTransform::map((QPainterPath *)local_90);
        iVar3 = (*this->_vptr_QGraphicsItem[7])(this,(QPainterPath *)local_90,(ulong)mode);
        bVar5 = (byte)iVar3;
        QPainterPath::~QPainterPath((QPainterPath *)local_90);
        QPainterPath::~QPainterPath(local_98);
        puVar1 = &((this->d_ptr).d)->field_0x160;
        *(ulong *)puVar1 = *(ulong *)puVar1 & 0xfffffffff7ffffff;
        goto LAB_005ec7e1;
      }
    }
    local_90._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    if ((*(uint *)&((other->d_ptr).d)->field_0x161 & 0x8000200) == 0) {
      (*other->_vptr_QGraphicsItem[4])(local_90,other);
    }
    else {
      clipPath((QGraphicsItem *)local_90);
    }
    itemTransform((QTransform *)(local_90 + 8),other,this,(bool *)0x0);
    QTransform::map(local_98);
    iVar3 = (*this->_vptr_QGraphicsItem[7])(this,local_98,(ulong)mode);
    bVar5 = (byte)iVar3;
    QPainterPath::~QPainterPath(local_98);
    QPainterPath::~QPainterPath((QPainterPath *)local_90);
  }
LAB_005ec7e1:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)(bVar5 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QGraphicsItem::collidesWithItem(const QGraphicsItem *other, Qt::ItemSelectionMode mode) const
{
    if (other == this)
        return true;
    if (!other)
        return false;
    // The items share the same clip if their closest clipper is the same, or
    // if one clips the other.
    bool clips = (d_ptr->ancestorFlags & QGraphicsItemPrivate::AncestorClipsChildren);
    bool otherClips = (other->d_ptr->ancestorFlags & QGraphicsItemPrivate::AncestorClipsChildren);
    if (clips || otherClips) {
        const QGraphicsItem *closestClipper = isAncestorOf(other) ? this : parentItem();
        while (closestClipper && !(closestClipper->flags() & ItemClipsChildrenToShape))
            closestClipper = closestClipper->parentItem();
        const QGraphicsItem *otherClosestClipper = other->isAncestorOf(this) ? other : other->parentItem();
        while (otherClosestClipper && !(otherClosestClipper->flags() & ItemClipsChildrenToShape))
            otherClosestClipper = otherClosestClipper->parentItem();
        if (closestClipper == otherClosestClipper) {
            d_ptr->localCollisionHack = 1;
            bool res = collidesWithPath(mapFromItem(other, other->shape()), mode);
            d_ptr->localCollisionHack = 0;
            return res;
        }
    }

    QPainterPath otherShape = other->isClipped() ? other->clipPath() : other->shape();
    return collidesWithPath(mapFromItem(other, otherShape), mode);
}